

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void lws_server_get_canonical_hostname(lws_context *context,lws_context_creation_info *info)

{
  if ((info->options & 4) == 0) {
    gethostname(context->canonical_hostname,0x5f);
    _lws_log(8," canonical_hostname = %s\n",context);
    return;
  }
  return;
}

Assistant:

void
lws_server_get_canonical_hostname(struct lws_context *context,
				  const struct lws_context_creation_info *info)
{
	if (lws_check_opt(info->options,
			LWS_SERVER_OPTION_SKIP_SERVER_CANONICAL_NAME))
		return;
#if !defined(LWS_PLAT_FREERTOS)
	/* find canonical hostname */
	gethostname((char *)context->canonical_hostname,
		    sizeof(context->canonical_hostname) - 1);

	lwsl_info(" canonical_hostname = %s\n", context->canonical_hostname);
#else
	(void)context;
#endif
}